

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O1

int Bac_PtrMemoryNtk(Vec_Ptr_t *vNtk)

{
  void **ppvVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  if (vNtk == (Vec_Ptr_t *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = vNtk->nCap;
    auVar11._8_4_ = iVar4 >> 0x1f;
    auVar11._0_8_ = (long)iVar4;
    auVar11._12_4_ = 0x45300000;
    iVar4 = (int)(((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0)) * 8.0 + 16.0);
  }
  iVar7 = vNtk->nSize;
  if (1 < iVar7) {
    ppvVar1 = vNtk->pArray;
    if ((int *)ppvVar1[1] == (int *)0x0) {
      iVar5 = 0;
    }
    else {
      iVar5 = *ppvVar1[1];
      auVar12._8_4_ = iVar5 >> 0x1f;
      auVar12._0_8_ = (long)iVar5;
      auVar12._12_4_ = 0x45300000;
      iVar5 = (int)(((auVar12._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,iVar5) - 4503599627370496.0)) * 8.0 + 16.0);
    }
    if (iVar7 != 2) {
      if ((int *)ppvVar1[2] == (int *)0x0) {
        iVar3 = 0;
      }
      else {
        iVar3 = *ppvVar1[2];
        auVar13._8_4_ = iVar3 >> 0x1f;
        auVar13._0_8_ = (long)iVar3;
        auVar13._12_4_ = 0x45300000;
        iVar3 = (int)(((auVar13._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0)) * 8.0 + 16.0);
      }
      if (3 < iVar7) {
        lVar9 = (long)*(int *)((long)ppvVar1[3] + 4);
        if (lVar9 < 1) {
          iVar8 = 0;
        }
        else {
          lVar10 = 0;
          iVar8 = 0;
          do {
            piVar2 = *(int **)(*(long *)((long)ppvVar1[3] + 8) + lVar10 * 8);
            iVar6 = 0;
            if (piVar2 != (int *)0x0) {
              iVar6 = *piVar2;
              auVar14._8_4_ = iVar6 >> 0x1f;
              auVar14._0_8_ = (long)iVar6;
              auVar14._12_4_ = 0x45300000;
              iVar6 = (int)(((auVar14._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,iVar6) - 4503599627370496.0)) * 8.0 + 16.0)
              ;
            }
            iVar8 = iVar8 + iVar6;
            lVar10 = lVar10 + 1;
          } while (lVar9 != lVar10);
        }
        if (iVar7 != 4) {
          lVar9 = (long)*(int *)((long)ppvVar1[4] + 4);
          if (lVar9 < 1) {
            iVar7 = 0;
          }
          else {
            lVar10 = 0;
            iVar7 = 0;
            do {
              piVar2 = *(int **)(*(long *)((long)ppvVar1[4] + 8) + lVar10 * 8);
              iVar6 = 0;
              if (piVar2 != (int *)0x0) {
                iVar6 = *piVar2;
                auVar15._8_4_ = iVar6 >> 0x1f;
                auVar15._0_8_ = (long)iVar6;
                auVar15._12_4_ = 0x45300000;
                iVar6 = (int)(((auVar15._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,iVar6) - 4503599627370496.0)) * 8.0 +
                             16.0);
              }
              iVar7 = iVar7 + iVar6;
              lVar10 = lVar10 + 1;
            } while (lVar9 != lVar10);
          }
          return iVar3 + iVar8 + iVar5 + iVar4 + iVar7;
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Bac_PtrMemoryNtk( Vec_Ptr_t * vNtk )
{
    int nBytes = (int)Vec_PtrMemory(vNtk);
    nBytes += Bac_PtrMemoryArray( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1) );
    nBytes += Bac_PtrMemoryArray( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2) );
    nBytes += Bac_PtrMemoryArrayArray( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3) );
    nBytes += Bac_PtrMemoryArrayArray( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4) );
    return nBytes;
}